

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O3

int * Extra_SupportArray(DdManager *dd,DdNode *f,int *support)

{
  uint uVar1;
  
  uVar1 = dd->size;
  if (dd->size < dd->sizeZ) {
    uVar1 = dd->sizeZ;
  }
  if (0 < (int)uVar1) {
    memset(support,0,(ulong)uVar1 << 2);
  }
  ddSupportStep((DdNode *)((ulong)f & 0xfffffffffffffffe),support);
  ddClearFlag((DdNode *)((ulong)f & 0xfffffffffffffffe));
  return support;
}

Assistant:

int * 
Extra_SupportArray(
  DdManager * dd, /* manager */
  DdNode * f,     /* DD whose support is sought */
  int * support ) /* array allocated by the user */
{
    int i, size;

    /* Initialize support array for ddSupportStep. */
    size = ddMax(dd->size, dd->sizeZ);
    for (i = 0; i < size; i++) 
        support[i] = 0;
    
    /* Compute support and clean up markers. */
    ddSupportStep(Cudd_Regular(f),support);
    ddClearFlag(Cudd_Regular(f));

    return(support);

}